

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O2

ostream * sciplot::gnuplot::
          writedataset<std::valarray<double>,std::vector<double,std::allocator<double>>>
                    (ostream *out,size_t index,valarray<double> *args,
                    vector<double,_std::allocator<double>_> *args_1)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,
                           "#=============================================================================="
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"# DATASET #");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,
                           "#=============================================================================="
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  internal::write<std::valarray<double>,std::vector<double,std::allocator<double>>>(out,args,args_1)
  ;
  std::operator<<(out,"\n\n");
  return out;
}

Assistant:

auto writedataset(std::ostream& out, std::size_t index, const Args&... args) -> std::ostream&
{
    // Save the given vectors x and y in a new data set of the data file
    out << "#==============================================================================" << std::endl;
    out << "# DATASET #" << index << std::endl;
    out << "#==============================================================================" << std::endl;

    // White the vector arguments to the ostream object
    internal::write(out, args...);

    // Ensure two blank lines are added here so that gnuplot understands a new data set has been added
    out << "\n\n";

    return out;
}